

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O2

bool __thiscall
Diligent::RenderPassCache::RenderPassCacheKey::operator==
          (RenderPassCacheKey *this,RenderPassCacheKey *rhs)

{
  TEXTURE_FORMAT *pTVar1;
  TEXTURE_FORMAT *pTVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  
  sVar3 = GetHash(this);
  sVar4 = GetHash(rhs);
  if ((((sVar3 == sVar4) && (this->NumRenderTargets == rhs->NumRenderTargets)) &&
      (this->SampleCount == rhs->SampleCount)) &&
     (((this->EnableVRS == rhs->EnableVRS && (this->DSVFormat == rhs->DSVFormat)) &&
      (this->ReadOnlyDSV == rhs->ReadOnlyDSV)))) {
    uVar5 = 0;
    do {
      bVar6 = this->NumRenderTargets == uVar5;
      if (bVar6) {
        return bVar6;
      }
      pTVar1 = this->RTVFormats + uVar5;
      pTVar2 = rhs->RTVFormats + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pTVar1 == *pTVar2);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool operator==(const RenderPassCacheKey& rhs) const noexcept
        {
            // clang-format off
            if (GetHash()        != rhs.GetHash()        ||
                NumRenderTargets != rhs.NumRenderTargets ||
                SampleCount      != rhs.SampleCount      ||
                EnableVRS        != rhs.EnableVRS        ||
                DSVFormat        != rhs.DSVFormat        ||
                ReadOnlyDSV      != rhs.ReadOnlyDSV)
            {
                return false;
            }
            // clang-format on

            for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                if (RTVFormats[rt] != rhs.RTVFormats[rt])
                    return false;

            return true;
        }